

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::Swap
          (RepeatedField<google::protobuf::UnknownField> *this,
          RepeatedField<google::protobuf::UnknownField> *other)

{
  ulong uVar1;
  int iVar2;
  Arena *pAVar3;
  Arena *arena;
  HeapRep *pHVar4;
  RepeatedField<google::protobuf::UnknownField> temp;
  ShortSooRep SStack_28;
  
  if (this != other) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      pAVar3 = protobuf::internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      pHVar4 = heap_rep(this);
      pAVar3 = (pHVar4->field_0).arena;
    }
    if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      arena = protobuf::internal::SooRep::soo_arena(&other->soo_rep_);
    }
    else {
      pHVar4 = heap_rep(other);
      arena = (pHVar4->field_0).arena;
    }
    if (pAVar3 == arena) {
      InternalSwap(this,other);
      return;
    }
    protobuf::internal::ShortSooRep::ShortSooRep(&SStack_28,arena);
    MergeFrom((RepeatedField<google::protobuf::UnknownField> *)&SStack_28,this);
    uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
    if ((uVar1 & 4) != 0) {
      protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    }
    protobuf::internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != 0) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,0);
    MergeFrom(this,other);
    UnsafeArenaSwap(other,(RepeatedField<google::protobuf::UnknownField> *)&SStack_28);
    ~RepeatedField((RepeatedField<google::protobuf::UnknownField> *)&SStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}